

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

void __thiscall cmNinjaTargetGenerator::WriteCompileRule(cmNinjaTargetGenerator *this,string *lang)

{
  pointer *ppbVar1;
  cmMakefile *this_00;
  cmLocalNinjaGenerator *pcVar2;
  cmGeneratorTarget *pcVar3;
  pointer pcVar4;
  size_type sVar5;
  bool bVar6;
  TargetType targetType;
  int iVar7;
  int iVar8;
  int iVar9;
  string *psVar10;
  undefined4 extraout_var;
  cmGlobalNinjaGenerator *pcVar11;
  char *pcVar12;
  long *plVar13;
  ostream *poVar14;
  char *__s;
  char *__s_00;
  size_t sVar15;
  size_type *psVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  _Alloc_hider str;
  cmOutputConverter *pcVar19;
  pointer pbVar20;
  string ppVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compileCmds;
  string ppDeptype;
  string ppCmd;
  string ppDepfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string ppCmdLine;
  auto_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander;
  string launcher;
  string tdi;
  ostringstream description;
  size_type local_6a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6a0 [6];
  ios_base local_640 [264];
  string local_538;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ddCmds;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  string local_4d8;
  string cldeps;
  ostringstream comment;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488 [6];
  ios_base local_428 [264];
  string local_320;
  string depfile;
  string deptype;
  string flags;
  string cmdLine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ppCmds;
  string rspfile;
  string responseFlag;
  string rspcontent;
  string local_138;
  RuleVariables vars;
  
  cmRulePlaceholderExpander::RuleVariables::RuleVariables(&vars);
  psVar10 = cmGeneratorTarget::GetName_abi_cxx11_
                      ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  vars.CMTargetName = (psVar10->_M_dataplus)._M_p;
  targetType = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
  vars.CMTargetType = cmState::GetTargetTypeName(targetType);
  vars.Language = (lang->_M_dataplus)._M_p;
  vars.Source = "$in";
  vars.Object = "$out";
  vars.Defines = "$DEFINES";
  vars.Includes = "$INCLUDES";
  vars.TargetPDB = "$TARGET_PDB";
  vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";
  vars.ObjectDir = "$OBJECT_DIR";
  vars.ObjectFileDir = "$OBJECT_FILE_DIR";
  iVar7 = std::__cxx11::string::compare((char *)lang);
  iVar8 = std::__cxx11::string::compare((char *)lang);
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  flags._M_dataplus._M_p = (pointer)&flags.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&flags,"$FLAGS","");
  rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
  rspfile._M_string_length = 0;
  rspfile.field_2._M_local_buf[0] = '\0';
  rspcontent._M_dataplus._M_p = (pointer)&rspcontent.field_2;
  rspcontent._M_string_length = 0;
  rspcontent.field_2._M_local_buf[0] = '\0';
  responseFlag._M_dataplus._M_p = (pointer)&responseFlag.field_2;
  responseFlag._M_string_length = 0;
  responseFlag.field_2._M_local_buf[0] = '\0';
  iVar9 = std::__cxx11::string::compare((char *)lang);
  if (((iVar9 != 0) && (iVar9 = std::__cxx11::string::compare((char *)lang), iVar9 != 0)) &&
     (bVar6 = ForceResponseFile(this), bVar6)) {
    std::__cxx11::string::_M_replace((ulong)&rspfile,0,(char *)rspfile._M_string_length,0x563f64);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,"@"
                   ,&rspfile);
    std::__cxx11::string::operator=((string *)&responseFlag,(string *)&comment);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_488) {
      operator_delete(_comment,local_488[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_replace
              ((ulong)&rspcontent,0,(char *)rspcontent._M_string_length,0x563f6e);
    std::__cxx11::string::_M_assign((string *)&flags);
    vars.Defines = "";
    vars.Includes = "";
  }
  deptype._M_dataplus._M_p = (pointer)&deptype.field_2;
  deptype._M_string_length = 0;
  deptype.field_2._M_local_buf[0] = '\0';
  depfile._M_dataplus._M_p = (pointer)&depfile.field_2;
  depfile._M_string_length = 0;
  depfile.field_2._M_local_buf[0] = '\0';
  cldeps._M_dataplus._M_p = (pointer)&cldeps.field_2;
  cldeps._M_string_length = 0;
  cldeps.field_2._M_local_buf[0] = '\0';
  if (iVar7 != 0) {
    bVar6 = NeedDepTypeMSVC(this,lang);
    if (bVar6) {
      std::__cxx11::string::_M_replace((ulong)&deptype,0,(char *)deptype._M_string_length,0x563dba);
      std::__cxx11::string::_M_replace((ulong)&depfile,0,(char *)depfile._M_string_length,0x57d84e);
      std::__cxx11::string::append((char *)&flags);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                     "CMAKE_NINJA_CMCLDEPS_",lang);
      bVar6 = cmMakefile::IsOn(this_00,(string *)&comment);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_comment != local_488) {
        operator_delete(_comment,local_488[0]._M_allocated_capacity + 1);
      }
      if (bVar6) {
        bVar6 = cmMakefile::GetIsSourceFileTryCompile(this_00);
        if (bVar6) goto LAB_0039283b;
        std::__cxx11::string::_M_replace
                  ((ulong)&deptype,0,(char *)deptype._M_string_length,0x563fae);
        std::__cxx11::string::_M_replace
                  ((ulong)&depfile,0,(char *)depfile._M_string_length,0x564068);
        _description = (pointer)local_6a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&description,"CMAKE_C_COMPILER","");
        pcVar12 = cmMakefile::GetDefinition(this_00,(string *)&description);
        local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
        if (pcVar12 == (char *)0x0) {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_4d8,"CMAKE_CXX_COMPILER","");
          pcVar12 = cmMakefile::GetSafeDefinition(this_00,&local_4d8);
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_4d8,"CMAKE_C_COMPILER","");
          pcVar12 = cmMakefile::GetSafeDefinition(this_00,&local_4d8);
        }
        std::__cxx11::string::string((string *)&comment,pcVar12,(allocator *)&cmdLine);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
          operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_description != local_6a0) {
          operator_delete(_description,local_6a0[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_replace((ulong)&cldeps,0,(char *)cldeps._M_string_length,0x56c0a3);
        psVar10 = cmSystemTools::GetCMClDepsCommand_abi_cxx11_();
        std::__cxx11::string::_M_append((char *)&cldeps,(ulong)(psVar10->_M_dataplus)._M_p);
        std::operator+(&launcher,"\" ",lang);
        plVar13 = (long *)std::__cxx11::string::append((char *)&launcher);
        psVar16 = (size_type *)(plVar13 + 2);
        if ((size_type *)*plVar13 == psVar16) {
          tdi.field_2._M_allocated_capacity = *psVar16;
          tdi.field_2._8_8_ = plVar13[3];
          tdi._M_dataplus._M_p = (pointer)&tdi.field_2;
        }
        else {
          tdi.field_2._M_allocated_capacity = *psVar16;
          tdi._M_dataplus._M_p = (pointer)*plVar13;
        }
        tdi._M_string_length = plVar13[1];
        *plVar13 = (long)psVar16;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&tdi);
        paVar17 = &cmdLine.field_2;
        psVar16 = (size_type *)(plVar13 + 2);
        if ((size_type *)*plVar13 == psVar16) {
          cmdLine.field_2._M_allocated_capacity = *psVar16;
          cmdLine.field_2._8_8_ = plVar13[3];
          cmdLine._M_dataplus._M_p = (pointer)paVar17;
        }
        else {
          cmdLine.field_2._M_allocated_capacity = *psVar16;
          cmdLine._M_dataplus._M_p = (pointer)*plVar13;
        }
        cmdLine._M_string_length = plVar13[1];
        *plVar13 = (long)psVar16;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&cmdLine);
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 == paVar18) {
          local_6a0[0]._0_8_ = paVar18->_M_allocated_capacity;
          local_6a0[0]._8_8_ = plVar13[3];
          _description = (pointer)local_6a0;
        }
        else {
          local_6a0[0]._0_8_ = paVar18->_M_allocated_capacity;
          _description = (pointer)*plVar13;
        }
        *plVar13 = (long)paVar18;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&cldeps,(ulong)_description);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_description != local_6a0) {
          operator_delete(_description,local_6a0[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)cmdLine._M_dataplus._M_p != paVar17) {
          operator_delete(cmdLine._M_dataplus._M_p,cmdLine.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)tdi._M_dataplus._M_p != &tdi.field_2) {
          operator_delete(tdi._M_dataplus._M_p,tdi.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)launcher._M_dataplus._M_p != &launcher.field_2) {
          operator_delete(launcher._M_dataplus._M_p,
                          CONCAT71(launcher.field_2._M_allocated_capacity._1_7_,
                                   launcher.field_2._M_local_buf[0]) + 1);
        }
        _description = (pointer)local_6a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&description,"CMAKE_CL_SHOWINCLUDES_PREFIX","");
        cmMakefile::GetSafeDefinition(this_00,(string *)&description);
        std::__cxx11::string::append((char *)&cldeps);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_description != local_6a0) {
          operator_delete(_description,local_6a0[0]._M_allocated_capacity + 1);
        }
        std::operator+(&cmdLine,"\" \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment
                      );
        plVar13 = (long *)std::__cxx11::string::append((char *)&cmdLine);
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 == paVar18) {
          local_6a0[0]._0_8_ = paVar18->_M_allocated_capacity;
          local_6a0[0]._8_8_ = plVar13[3];
          _description = (pointer)local_6a0;
        }
        else {
          local_6a0[0]._0_8_ = paVar18->_M_allocated_capacity;
          _description = (pointer)*plVar13;
        }
        *plVar13 = (long)paVar18;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&cldeps,(ulong)_description);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_description != local_6a0) {
          operator_delete(_description,local_6a0[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)cmdLine._M_dataplus._M_p != paVar17) {
          operator_delete(cmdLine._M_dataplus._M_p,cmdLine.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_comment == local_488) goto LAB_0039283b;
      }
      else {
        std::__cxx11::string::_M_replace
                  ((ulong)&deptype,0,(char *)deptype._M_string_length,0x563fae);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment
                       ,"CMAKE_NINJA_DEPTYPE_",lang);
        pcVar12 = cmMakefile::GetDefinition(this_00,(string *)&comment);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_comment != local_488) {
          operator_delete(_comment,local_488[0]._M_allocated_capacity + 1);
        }
        sVar5 = deptype._M_string_length;
        if (pcVar12 != (char *)0x0) {
          strlen(pcVar12);
          std::__cxx11::string::_M_replace((ulong)&deptype,0,(char *)sVar5,(ulong)pcVar12);
        }
        std::__cxx11::string::_M_replace
                  ((ulong)&depfile,0,(char *)depfile._M_string_length,0x564068);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment
                       ,"CMAKE_DEPFILE_FLAGS_",lang);
        pcVar12 = cmMakefile::GetSafeDefinition(this_00,(string *)&comment);
        std::__cxx11::string::string((string *)&description,pcVar12,(allocator *)&cmdLine);
        if (local_6a8 != 0) {
          cmsys::SystemTools::ReplaceString((string *)&description,"<DEPFILE>","$DEP_FILE");
          cmsys::SystemTools::ReplaceString((string *)&description,"<OBJECT>","$out");
          paVar17 = &cmdLine.field_2;
          cmdLine._M_dataplus._M_p = (pointer)paVar17;
          std::__cxx11::string::_M_construct<char_const*>((string *)&cmdLine,"CMAKE_C_COMPILER","");
          pcVar12 = cmMakefile::GetDefinition(this_00,&cmdLine);
          cmsys::SystemTools::ReplaceString((string *)&description,"<CMAKE_C_COMPILER>",pcVar12);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)cmdLine._M_dataplus._M_p != paVar17) {
            operator_delete(cmdLine._M_dataplus._M_p,cmdLine.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&cmdLine," ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &description);
          std::__cxx11::string::_M_append((char *)&flags,(ulong)cmdLine._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)cmdLine._M_dataplus._M_p != paVar17) {
            operator_delete(cmdLine._M_dataplus._M_p,cmdLine.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_description != local_6a0) {
          operator_delete(_description,local_6a0[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_comment == local_488) goto LAB_0039283b;
      }
      operator_delete(_comment,local_488[0]._M_allocated_capacity + 1);
    }
  }
LAB_0039283b:
  vars.Flags = flags._M_dataplus._M_p;
  vars.DependencyFile = depfile._M_dataplus._M_p;
  iVar9 = (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
            _vptr_cmLocalGenerator[5])();
  rulePlaceholderExpander.x_ = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar9);
  pcVar2 = this->LocalGenerator;
  GetTargetDependInfoPath((string *)&description,this,lang);
  pcVar11 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  cmGlobalNinjaGenerator::ConvertToNinjaPath((string *)&comment,pcVar11,(string *)&description);
  cmOutputConverter::ConvertToOutputFormat
            (&tdi,&(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                   super_cmOutputConverter,(string *)&comment,SHELL);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_comment != local_488) {
    operator_delete(_comment,local_488[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_description != local_6a0) {
    operator_delete(_description,local_6a0[0]._M_allocated_capacity + 1);
  }
  launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
  launcher._M_string_length = 0;
  launcher.field_2._M_local_buf[0] = '\0';
  pcVar3 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar2 = this->LocalGenerator;
  _comment = (pointer)local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)&comment,"RULE_LAUNCH_COMPILE","");
  pcVar12 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar2,pcVar3,(string *)&comment);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_comment != local_488) {
    operator_delete(_comment,local_488[0]._M_allocated_capacity + 1);
  }
  sVar5 = launcher._M_string_length;
  if ((pcVar12 != (char *)0x0) && (*pcVar12 != '\0')) {
    strlen(pcVar12);
    std::__cxx11::string::_M_replace((ulong)&launcher,0,(char *)sVar5,(ulong)pcVar12);
    std::__cxx11::string::append((char *)&launcher);
  }
  if (iVar7 == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                   "CMAKE_",lang);
    plVar13 = (long *)std::__cxx11::string::append((char *)&comment);
    ppVar._M_dataplus._M_p = (pointer)&ppVar.field_2;
    psVar16 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar16) {
      ppVar.field_2._M_allocated_capacity = *psVar16;
      ppVar.field_2._8_8_ = plVar13[3];
    }
    else {
      ppVar.field_2._M_allocated_capacity = *psVar16;
      ppVar._M_dataplus._M_p = (pointer)*plVar13;
    }
    ppVar._M_string_length = plVar13[1];
    *plVar13 = (long)psVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_488) {
      operator_delete(_comment,local_488[0]._M_allocated_capacity + 1);
    }
    pcVar12 = cmMakefile::GetRequiredDefinition
                        ((this->super_cmCommonTargetGenerator).Makefile,&ppVar);
    std::__cxx11::string::string((string *)&ppCmd,pcVar12,(allocator *)&comment);
    ppDeptype._M_dataplus._M_p = (pointer)&ppDeptype.field_2;
    ppDeptype._M_string_length = 0;
    ppDeptype.field_2._M_local_buf[0] = '\0';
    ppDepfile._M_dataplus._M_p = (pointer)&ppDepfile.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ppDepfile,"$DEP_FILE","");
    cmRulePlaceholderExpander::RuleVariables::RuleVariables((RuleVariables *)&cmdLine);
    cmdLine._M_dataplus._M_p = vars.CMTargetName;
    cmdLine._M_string_length = (size_type)vars.CMTargetType;
    vars.Source = "$in";
    vars.Defines = "";
    ppCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ppCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ppCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmSystemTools::ExpandListArgument(&ppCmd,&ppCmds,false);
    if (ppCmds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        ppCmds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar20 = ppCmds.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment
                       ,&launcher,pbVar20);
        std::__cxx11::string::operator=((string *)pbVar20,(string *)&comment);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_comment != local_488) {
          operator_delete(_comment,local_488[0]._M_allocated_capacity + 1);
        }
        pcVar19 = &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                   super_cmOutputConverter;
        if (this->LocalGenerator == (cmLocalNinjaGenerator *)0x0) {
          pcVar19 = (cmOutputConverter *)0x0;
        }
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (rulePlaceholderExpander.x_,pcVar19,pbVar20,(RuleVariables *)&cmdLine);
        pbVar20 = pbVar20 + 1;
      } while (pbVar20 !=
               ppCmds.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    pcVar2 = this->LocalGenerator;
    psVar10 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&compileCmds,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,psVar10,SHELL);
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str,
               compileCmds.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (long)&((compileCmds.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p +
               (long)&((compileCmds.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&__str);
    plVar13 = (long *)std::__cxx11::string::_M_append((char *)&__str,(ulong)tdi._M_dataplus._M_p);
    psVar16 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar16) {
      ppCmdLine.field_2._M_allocated_capacity = *psVar16;
      ppCmdLine.field_2._8_8_ = plVar13[3];
      ppCmdLine._M_dataplus._M_p = (pointer)&ppCmdLine.field_2;
    }
    else {
      ppCmdLine.field_2._M_allocated_capacity = *psVar16;
      ppCmdLine._M_dataplus._M_p = (pointer)*plVar13;
    }
    ppCmdLine._M_string_length = plVar13[1];
    *plVar13 = (long)psVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&ppCmdLine);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 == paVar17) {
      local_6a0[0]._0_8_ = paVar17->_M_allocated_capacity;
      local_6a0[0]._8_8_ = plVar13[3];
      _description = (pointer)local_6a0;
    }
    else {
      local_6a0[0]._0_8_ = paVar17->_M_allocated_capacity;
      _description = (pointer)*plVar13;
    }
    *plVar13 = (long)paVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&description);
    _comment = (pointer)local_488;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 == paVar17) {
      local_488[0]._0_8_ = paVar17->_M_allocated_capacity;
      local_488[0]._8_8_ = plVar13[3];
    }
    else {
      local_488[0]._0_8_ = paVar17->_M_allocated_capacity;
      _comment = (pointer)*plVar13;
    }
    *plVar13 = (long)paVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ppCmds,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_488) {
      operator_delete(_comment,local_488[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_description != local_6a0) {
      operator_delete(_description,local_6a0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppCmdLine._M_dataplus._M_p != &ppCmdLine.field_2) {
      operator_delete(ppCmdLine._M_dataplus._M_p,ppCmdLine.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    cmLocalNinjaGenerator::BuildCommandLine(&ppCmdLine,this->LocalGenerator,&ppCmds);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&comment,"Rule for preprocessing ",0x17);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&comment,(lang->_M_dataplus)._M_p,lang->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," files.",7);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&description);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&description,"Building ",9);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&description,(lang->_M_dataplus)._M_p,lang->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," preprocessed $out",0x12);
    pcVar11 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    LanguagePreprocessRule(&__str,this,lang);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    local_4f8._M_allocated_capacity = (size_type)&local_4e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"");
    ddCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&ddCmds.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ddCmds,"");
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"");
    cmGlobalNinjaGenerator::AddRule
              (pcVar11,&__str,&ppCmdLine,&local_538,&local_320,&ppDepfile,&ppDeptype,
               (string *)&local_4f8,(string *)&ddCmds,&local_138,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if (ddCmds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&ddCmds.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(ddCmds.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((ddCmds.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_allocated_capacity != &local_4e8) {
      operator_delete((void *)local_4f8._M_allocated_capacity,local_4e8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_dataplus._M_p != &local_538.field_2) {
      operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&description);
    std::ios_base::~ios_base(local_640);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
    std::ios_base::~ios_base(local_428);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppCmdLine._M_dataplus._M_p != &ppCmdLine.field_2) {
      operator_delete(ppCmdLine._M_dataplus._M_p,ppCmdLine.field_2._M_allocated_capacity + 1);
    }
    if (compileCmds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&compileCmds.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(compileCmds.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((compileCmds.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ppCmds);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppDepfile._M_dataplus._M_p != &ppDepfile.field_2) {
      operator_delete(ppDepfile._M_dataplus._M_p,ppDepfile.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppDeptype._M_dataplus._M_p != &ppDeptype.field_2) {
      operator_delete(ppDeptype._M_dataplus._M_p,
                      CONCAT71(ppDeptype.field_2._M_allocated_capacity._1_7_,
                               ppDeptype.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppCmd._M_dataplus._M_p != &ppCmd.field_2) {
      operator_delete(ppCmd._M_dataplus._M_p,ppCmd.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppVar._M_dataplus._M_p != &ppVar.field_2) {
      operator_delete(ppVar._M_dataplus._M_p,ppVar.field_2._M_allocated_capacity + 1);
    }
  }
  if (iVar8 == 0) {
    ddCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ddCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ddCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmdLine._M_dataplus._M_p = (pointer)&cmdLine.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&cmdLine,"$out.rsp","");
    ppVar._M_dataplus._M_p = (pointer)&ppVar.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ppVar,"$in","");
    std::operator+(&ppCmd,"@",&cmdLine);
    pcVar2 = this->LocalGenerator;
    psVar10 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmOutputConverter::ConvertToOutputFormat
              (&ppDeptype,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,psVar10,SHELL);
    ppbVar1 = &compileCmds.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    compileCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&compileCmds,ppDeptype._M_dataplus._M_p,
               ppDeptype._M_dataplus._M_p + ppDeptype._M_string_length);
    std::__cxx11::string::append((char *)&compileCmds);
    plVar13 = (long *)std::__cxx11::string::_M_append
                                ((char *)&compileCmds,(ulong)tdi._M_dataplus._M_p);
    psVar16 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar16) {
      ppDepfile.field_2._M_allocated_capacity = *psVar16;
      ppDepfile.field_2._8_8_ = plVar13[3];
      ppDepfile._M_dataplus._M_p = (pointer)&ppDepfile.field_2;
    }
    else {
      ppDepfile.field_2._M_allocated_capacity = *psVar16;
      ppDepfile._M_dataplus._M_p = (pointer)*plVar13;
    }
    ppDepfile._M_string_length = plVar13[1];
    *plVar13 = (long)psVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&ppDepfile);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 == paVar17) {
      local_6a0[0]._0_8_ = paVar17->_M_allocated_capacity;
      local_6a0[0]._8_8_ = plVar13[3];
      _description = (pointer)local_6a0;
    }
    else {
      local_6a0[0]._0_8_ = paVar17->_M_allocated_capacity;
      _description = (pointer)*plVar13;
    }
    *plVar13 = (long)paVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::_M_append
                                ((char *)&description,(ulong)ppCmd._M_dataplus._M_p);
    _comment = (pointer)local_488;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 == paVar17) {
      local_488[0]._0_8_ = paVar17->_M_allocated_capacity;
      local_488[0]._8_8_ = plVar13[3];
    }
    else {
      local_488[0]._0_8_ = paVar17->_M_allocated_capacity;
      _comment = (pointer)*plVar13;
    }
    *plVar13 = (long)paVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ddCmds,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_488) {
      operator_delete(_comment,local_488[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_description != local_6a0) {
      operator_delete(_description,local_6a0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppDepfile._M_dataplus._M_p != &ppDepfile.field_2) {
      operator_delete(ppDepfile._M_dataplus._M_p,ppDepfile.field_2._M_allocated_capacity + 1);
    }
    if (compileCmds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
      operator_delete(compileCmds.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((compileCmds.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    cmLocalNinjaGenerator::BuildCommandLine(&ppDepfile,this->LocalGenerator,&ddCmds);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&comment,"Rule to generate ninja dyndep files for ",0x28);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&comment,(lang->_M_dataplus)._M_p,lang->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,".",1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&description);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&description,"Generating ",0xb);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&description,(lang->_M_dataplus)._M_p,lang->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," dyndep file $out",0x11);
    pcVar11 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    LanguageDyndepRule((string *)&compileCmds,this,lang);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"");
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"");
    local_4f8._M_allocated_capacity = (size_type)&local_4e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"");
    cmGlobalNinjaGenerator::AddRule
              (pcVar11,(string *)&compileCmds,&ppDepfile,&ppCmdLine,&__str,&local_538,&local_320,
               &cmdLine,&ppVar,(string *)&local_4f8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_allocated_capacity != &local_4e8) {
      operator_delete((void *)local_4f8._M_allocated_capacity,local_4e8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_dataplus._M_p != &local_538.field_2) {
      operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppCmdLine._M_dataplus._M_p != &ppCmdLine.field_2) {
      operator_delete(ppCmdLine._M_dataplus._M_p,ppCmdLine.field_2._M_allocated_capacity + 1);
    }
    if (compileCmds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&compileCmds.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(compileCmds.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((compileCmds.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&description);
    std::ios_base::~ios_base(local_640);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
    std::ios_base::~ios_base(local_428);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppDepfile._M_dataplus._M_p != &ppDepfile.field_2) {
      operator_delete(ppDepfile._M_dataplus._M_p,ppDepfile.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppDeptype._M_dataplus._M_p != &ppDeptype.field_2) {
      operator_delete(ppDeptype._M_dataplus._M_p,
                      CONCAT71(ppDeptype.field_2._M_allocated_capacity._1_7_,
                               ppDeptype.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppCmd._M_dataplus._M_p != &ppCmd.field_2) {
      operator_delete(ppCmd._M_dataplus._M_p,ppCmd.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppVar._M_dataplus._M_p != &ppVar.field_2) {
      operator_delete(ppVar._M_dataplus._M_p,ppVar.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmdLine._M_dataplus._M_p != &cmdLine.field_2) {
      operator_delete(cmdLine._M_dataplus._M_p,cmdLine.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ddCmds);
  }
  compileCmds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  compileCmds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  compileCmds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar7 = std::__cxx11::string::compare((char *)lang);
  if (iVar7 == 0) {
    _comment = (pointer)local_488;
    local_488[0]._M_allocated_capacity = local_488[0]._M_allocated_capacity & 0xffffffffffffff00;
    pcVar3 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    _description = (pointer)local_6a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&description,"CUDA_SEPARABLE_COMPILATION","");
    bVar6 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,(string *)&description);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_description != local_6a0) {
      operator_delete(_description,local_6a0[0]._M_allocated_capacity + 1);
    }
    if (bVar6) {
      _description = (pointer)local_6a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&description,"CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION","");
    }
    else {
      pcVar3 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      _description = (pointer)local_6a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&description,"CUDA_PTX_COMPILATION","");
      bVar6 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,(string *)&description);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_description != local_6a0) {
        operator_delete(_description,local_6a0[0]._M_allocated_capacity + 1);
      }
      _description = (pointer)local_6a0;
      if (bVar6) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&description,"CMAKE_CUDA_COMPILE_PTX_COMPILATION","");
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&description,"CMAKE_CUDA_COMPILE_WHOLE_COMPILATION","");
      }
    }
    std::__cxx11::string::operator=((string *)&comment,(string *)&description);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_description != local_6a0) {
      operator_delete(_description,local_6a0[0]._M_allocated_capacity + 1);
    }
    pcVar12 = cmMakefile::GetRequiredDefinition(this_00,(string *)&comment);
    std::__cxx11::string::string((string *)&description,pcVar12,(allocator *)&cmdLine);
    cmSystemTools::ExpandListArgument((string *)&description,&compileCmds,false);
  }
  else {
    cmdLine._M_dataplus._M_p = (pointer)&cmdLine.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&cmdLine,"CMAKE_","");
    plVar13 = (long *)std::__cxx11::string::_M_append
                                ((char *)&cmdLine,(ulong)(lang->_M_dataplus)._M_p);
    _description = (pointer)local_6a0;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 == paVar17) {
      local_6a0[0]._0_8_ = paVar17->_M_allocated_capacity;
      local_6a0[0]._8_8_ = plVar13[3];
    }
    else {
      local_6a0[0]._0_8_ = paVar17->_M_allocated_capacity;
      _description = (pointer)*plVar13;
    }
    *plVar13 = (long)paVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&description);
    _comment = (pointer)local_488;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 == paVar17) {
      local_488[0]._0_8_ = paVar17->_M_allocated_capacity;
      local_488[0]._8_8_ = plVar13[3];
    }
    else {
      local_488[0]._0_8_ = paVar17->_M_allocated_capacity;
      _comment = (pointer)*plVar13;
    }
    *plVar13 = (long)paVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_description != local_6a0) {
      operator_delete(_description,local_6a0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmdLine._M_dataplus._M_p != &cmdLine.field_2) {
      operator_delete(cmdLine._M_dataplus._M_p,cmdLine.field_2._M_allocated_capacity + 1);
    }
    pcVar12 = cmMakefile::GetRequiredDefinition(this_00,(string *)&comment);
    std::__cxx11::string::string((string *)&description,pcVar12,(allocator *)&cmdLine);
    cmSystemTools::ExpandListArgument((string *)&description,&compileCmds,false);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_description != local_6a0) {
    operator_delete(_description,local_6a0[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_comment != local_488) {
    operator_delete(_comment,local_488[0]._M_allocated_capacity + 1);
  }
  if ((compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((iVar7 = std::__cxx11::string::compare((char *)lang), iVar7 == 0 ||
      (iVar7 = std::__cxx11::string::compare((char *)lang), iVar7 == 0)))) {
    _comment = (pointer)local_488;
    pcVar4 = (lang->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&comment,pcVar4,pcVar4 + lang->_M_string_length);
    std::__cxx11::string::append((char *)&comment);
    pcVar12 = cmGeneratorTarget::GetProperty
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)&comment);
    pcVar4 = (lang->_M_dataplus)._M_p;
    _description = (pointer)local_6a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&description,pcVar4,pcVar4 + lang->_M_string_length);
    std::__cxx11::string::append((char *)&description);
    __s = cmGeneratorTarget::GetProperty
                    ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)&description);
    cmdLine._M_dataplus._M_p = (pointer)&cmdLine.field_2;
    pcVar4 = (lang->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&cmdLine,pcVar4,pcVar4 + lang->_M_string_length);
    std::__cxx11::string::append((char *)&cmdLine);
    __s_00 = cmGeneratorTarget::GetProperty
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget,&cmdLine);
    if (((pcVar12 != (char *)0x0) && (*pcVar12 != '\0')) ||
       (((__s != (char *)0x0 && (*__s != '\0')) || ((__s_00 != (char *)0x0 && (*__s_00 != '\0'))))))
    {
      pcVar2 = this->LocalGenerator;
      psVar10 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      cmOutputConverter::ConvertToOutputFormat
                (&ppVar,&(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                         super_cmOutputConverter,psVar10,SHELL);
      std::__cxx11::string::append((char *)&ppVar);
      if ((pcVar12 != (char *)0x0) && (*pcVar12 != '\0')) {
        std::__cxx11::string::append((char *)&ppVar);
        pcVar2 = this->LocalGenerator;
        ppDeptype._M_dataplus._M_p = (pointer)&ppDeptype.field_2;
        sVar15 = strlen(pcVar12);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&ppDeptype,pcVar12,pcVar12 + sVar15);
        cmOutputConverter::EscapeForShell
                  (&ppCmd,&(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                           super_cmOutputConverter,&ppDeptype,false,false,false);
        std::__cxx11::string::_M_append((char *)&ppVar,(ulong)ppCmd._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)ppCmd._M_dataplus._M_p != &ppCmd.field_2) {
          operator_delete(ppCmd._M_dataplus._M_p,ppCmd.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)ppDeptype._M_dataplus._M_p != &ppDeptype.field_2) {
          operator_delete(ppDeptype._M_dataplus._M_p,
                          CONCAT71(ppDeptype.field_2._M_allocated_capacity._1_7_,
                                   ppDeptype.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((__s != (char *)0x0) && (*__s != '\0')) {
        std::__cxx11::string::append((char *)&ppVar);
        pcVar2 = this->LocalGenerator;
        ppDeptype._M_dataplus._M_p = (pointer)&ppDeptype.field_2;
        sVar15 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&ppDeptype,__s,__s + sVar15);
        cmOutputConverter::EscapeForShell
                  (&ppCmd,&(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                           super_cmOutputConverter,&ppDeptype,false,false,false);
        std::__cxx11::string::_M_append((char *)&ppVar,(ulong)ppCmd._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)ppCmd._M_dataplus._M_p != &ppCmd.field_2) {
          operator_delete(ppCmd._M_dataplus._M_p,ppCmd.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)ppDeptype._M_dataplus._M_p != &ppDeptype.field_2) {
          operator_delete(ppDeptype._M_dataplus._M_p,
                          CONCAT71(ppDeptype.field_2._M_allocated_capacity._1_7_,
                                   ppDeptype.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((__s_00 != (char *)0x0) && (*__s_00 != '\0')) {
        std::__cxx11::string::append((char *)&ppVar);
        pcVar2 = this->LocalGenerator;
        ppDeptype._M_dataplus._M_p = (pointer)&ppDeptype.field_2;
        sVar15 = strlen(__s_00);
        std::__cxx11::string::_M_construct<char_const*>((string *)&ppDeptype,__s_00,__s_00 + sVar15)
        ;
        cmOutputConverter::EscapeForShell
                  (&ppCmd,&(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                           super_cmOutputConverter,&ppDeptype,false,false,false);
        std::__cxx11::string::_M_append((char *)&ppVar,(ulong)ppCmd._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)ppCmd._M_dataplus._M_p != &ppCmd.field_2) {
          operator_delete(ppCmd._M_dataplus._M_p,ppCmd.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)ppDeptype._M_dataplus._M_p != &ppDeptype.field_2) {
          operator_delete(ppDeptype._M_dataplus._M_p,
                          CONCAT71(ppDeptype.field_2._M_allocated_capacity._1_7_,
                                   ppDeptype.field_2._M_local_buf[0]) + 1);
        }
      }
      if (((__s != (char *)0x0) && (*__s != '\0')) || ((__s_00 != (char *)0x0 && (*__s_00 != '\0')))
         ) {
        std::__cxx11::string::append((char *)&ppVar);
      }
      std::__cxx11::string::append((char *)&ppVar);
      std::__cxx11::string::replace
                ((ulong)compileCmds.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,0,(char *)0x0,
                 (ulong)ppVar._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppVar._M_dataplus._M_p != &ppVar.field_2) {
        operator_delete(ppVar._M_dataplus._M_p,ppVar.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmdLine._M_dataplus._M_p != &cmdLine.field_2) {
      operator_delete(cmdLine._M_dataplus._M_p,cmdLine.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_description != local_6a0) {
      operator_delete(_description,local_6a0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_488) {
      operator_delete(_comment,local_488[0]._M_allocated_capacity + 1);
    }
  }
  if ((compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (((iVar7 = std::__cxx11::string::compare((char *)lang), iVar7 == 0 ||
       (iVar7 = std::__cxx11::string::compare((char *)lang), iVar7 == 0)) ||
      (iVar7 = std::__cxx11::string::compare((char *)lang), iVar7 == 0)))) {
    _comment = (pointer)local_488;
    pcVar4 = (lang->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&comment,pcVar4,pcVar4 + lang->_M_string_length);
    std::__cxx11::string::append((char *)&comment);
    pcVar12 = cmGeneratorTarget::GetProperty
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)&comment);
    if ((pcVar12 != (char *)0x0) && (*pcVar12 != '\0')) {
      ppVar._M_dataplus._M_p = (pointer)0x0;
      ppVar._M_string_length = 0;
      ppVar.field_2._M_allocated_capacity = 0;
      _description = (pointer)local_6a0;
      sVar15 = strlen(pcVar12);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&description,pcVar12,pcVar12 + sVar15);
      cmSystemTools::ExpandListArgument
                ((string *)&description,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&ppVar,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_description != local_6a0) {
        operator_delete(_description,local_6a0[0]._M_allocated_capacity + 1);
      }
      sVar5 = ppVar._M_string_length;
      if (ppVar._M_dataplus._M_p != (pointer)ppVar._M_string_length) {
        str._M_p = ppVar._M_dataplus._M_p;
        do {
          cmOutputConverter::EscapeForShell
                    ((string *)&description,
                     &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                      super_cmOutputConverter,(string *)str._M_p,false,false,false);
          std::__cxx11::string::operator=((string *)str._M_p,(string *)&description);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_description != local_6a0) {
            operator_delete(_description,local_6a0[0]._M_allocated_capacity + 1);
          }
          str._M_p = str._M_p + 0x20;
        } while (str._M_p != (pointer)sVar5);
      }
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&cmdLine,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&ppVar," ");
      plVar13 = (long *)std::__cxx11::string::append((char *)&cmdLine);
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 == paVar17) {
        local_6a0[0]._0_8_ = paVar17->_M_allocated_capacity;
        local_6a0[0]._8_8_ = plVar13[3];
        _description = (pointer)local_6a0;
      }
      else {
        local_6a0[0]._0_8_ = paVar17->_M_allocated_capacity;
        _description = (pointer)*plVar13;
      }
      *plVar13 = (long)paVar17;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmdLine._M_dataplus._M_p != &cmdLine.field_2) {
        operator_delete(cmdLine._M_dataplus._M_p,cmdLine.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::replace
                ((ulong)compileCmds.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,0,(char *)0x0,(ulong)_description)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_description != local_6a0) {
        operator_delete(_description,local_6a0[0]._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ppVar);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_488) {
      operator_delete(_comment,local_488[0]._M_allocated_capacity + 1);
    }
  }
  if (compileCmds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      compileCmds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::replace
              ((ulong)compileCmds.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,0,(char *)0x0,
               (ulong)cldeps._M_dataplus._M_p);
  }
  if (compileCmds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      compileCmds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar20 = compileCmds.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                     &launcher,pbVar20);
      std::__cxx11::string::operator=((string *)pbVar20,(string *)&comment);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_comment != local_488) {
        operator_delete(_comment,local_488[0]._M_allocated_capacity + 1);
      }
      pcVar19 = &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                 super_cmOutputConverter;
      if (this->LocalGenerator == (cmLocalNinjaGenerator *)0x0) {
        pcVar19 = (cmOutputConverter *)0x0;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                (rulePlaceholderExpander.x_,pcVar19,pbVar20,&vars);
      pbVar20 = pbVar20 + 1;
    } while (pbVar20 !=
             compileCmds.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  cmLocalNinjaGenerator::BuildCommandLine(&cmdLine,this->LocalGenerator,&compileCmds);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&comment,"Rule for compiling ",0x13)
  ;
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&comment,(lang->_M_dataplus)._M_p,lang->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," files.",7);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&description);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&description,"Building ",9);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&description,(lang->_M_dataplus)._M_p,lang->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," object $out",0xc);
  pcVar11 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  LanguageCompilerRule(&ppVar,this,lang);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  ppDepfile._M_dataplus._M_p = (pointer)&ppDepfile.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ppDepfile,"");
  cmGlobalNinjaGenerator::AddRule
            (pcVar11,&ppVar,&cmdLine,&ppCmd,&ppDeptype,&depfile,&deptype,&rspfile,&rspcontent,
             &ppDepfile,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ppDepfile._M_dataplus._M_p != &ppDepfile.field_2) {
    operator_delete(ppDepfile._M_dataplus._M_p,ppDepfile.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ppDeptype._M_dataplus._M_p != &ppDeptype.field_2) {
    operator_delete(ppDeptype._M_dataplus._M_p,
                    CONCAT71(ppDeptype.field_2._M_allocated_capacity._1_7_,
                             ppDeptype.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ppCmd._M_dataplus._M_p != &ppCmd.field_2) {
    operator_delete(ppCmd._M_dataplus._M_p,ppCmd.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ppVar._M_dataplus._M_p != &ppVar.field_2) {
    operator_delete(ppVar._M_dataplus._M_p,ppVar.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&description);
  std::ios_base::~ios_base(local_640);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
  std::ios_base::~ios_base(local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmdLine._M_dataplus._M_p != &cmdLine.field_2) {
    operator_delete(cmdLine._M_dataplus._M_p,cmdLine.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&compileCmds);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)launcher._M_dataplus._M_p != &launcher.field_2) {
    operator_delete(launcher._M_dataplus._M_p,
                    CONCAT71(launcher.field_2._M_allocated_capacity._1_7_,
                             launcher.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tdi._M_dataplus._M_p != &tdi.field_2) {
    operator_delete(tdi._M_dataplus._M_p,tdi.field_2._M_allocated_capacity + 1);
  }
  cm::auto_ptr<cmRulePlaceholderExpander>::~auto_ptr(&rulePlaceholderExpander);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cldeps._M_dataplus._M_p != &cldeps.field_2) {
    operator_delete(cldeps._M_dataplus._M_p,
                    CONCAT71(cldeps.field_2._M_allocated_capacity._1_7_,
                             cldeps.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)depfile._M_dataplus._M_p != &depfile.field_2) {
    operator_delete(depfile._M_dataplus._M_p,
                    CONCAT71(depfile.field_2._M_allocated_capacity._1_7_,
                             depfile.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)deptype._M_dataplus._M_p != &deptype.field_2) {
    operator_delete(deptype._M_dataplus._M_p,
                    CONCAT71(deptype.field_2._M_allocated_capacity._1_7_,
                             deptype.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)responseFlag._M_dataplus._M_p != &responseFlag.field_2) {
    operator_delete(responseFlag._M_dataplus._M_p,
                    CONCAT71(responseFlag.field_2._M_allocated_capacity._1_7_,
                             responseFlag.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspcontent._M_dataplus._M_p != &rspcontent.field_2) {
    operator_delete(rspcontent._M_dataplus._M_p,
                    CONCAT71(rspcontent.field_2._M_allocated_capacity._1_7_,
                             rspcontent.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,
                    CONCAT71(rspfile.field_2._M_allocated_capacity._1_7_,
                             rspfile.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)flags._M_dataplus._M_p != &flags.field_2) {
    operator_delete(flags._M_dataplus._M_p,flags.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteCompileRule(const std::string& lang)
{
  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType());
  vars.Language = lang.c_str();
  vars.Source = "$in";
  vars.Object = "$out";
  vars.Defines = "$DEFINES";
  vars.Includes = "$INCLUDES";
  vars.TargetPDB = "$TARGET_PDB";
  vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";
  vars.ObjectDir = "$OBJECT_DIR";
  vars.ObjectFileDir = "$OBJECT_FILE_DIR";

  // For some cases we do an explicit preprocessor invocation.
  bool const explicitPP = this->NeedExplicitPreprocessing(lang);
  bool const needDyndep = this->NeedDyndep(lang);

  cmMakefile* mf = this->GetMakefile();

  std::string flags = "$FLAGS";
  std::string rspfile;
  std::string rspcontent;
  std::string responseFlag;

  bool const lang_supports_response = !(lang == "RC" || lang == "CUDA");
  if (lang_supports_response && this->ForceResponseFile()) {
    rspfile = "$RSP_FILE";
    responseFlag = "@" + rspfile;
    rspcontent = " $DEFINES $INCLUDES $FLAGS";
    flags = responseFlag;
    vars.Defines = "";
    vars.Includes = "";
  }

  // Tell ninja dependency format so all deps can be loaded into a database
  std::string deptype;
  std::string depfile;
  std::string cldeps;
  if (explicitPP) {
    // The explicit preprocessing step will handle dependency scanning.
  } else if (this->NeedDepTypeMSVC(lang)) {
    deptype = "msvc";
    depfile = "";
    flags += " /showIncludes";
  } else if (mf->IsOn("CMAKE_NINJA_CMCLDEPS_" + lang)) {
    // For the MS resource compiler we need cmcldeps, but skip dependencies
    // for source-file try_compile cases because they are always fresh.
    if (!mf->GetIsSourceFileTryCompile()) {
      deptype = "gcc";
      depfile = "$DEP_FILE";
      const std::string cl = mf->GetDefinition("CMAKE_C_COMPILER")
        ? mf->GetSafeDefinition("CMAKE_C_COMPILER")
        : mf->GetSafeDefinition("CMAKE_CXX_COMPILER");
      cldeps = "\"";
      cldeps += cmSystemTools::GetCMClDepsCommand();
      cldeps += "\" " + lang + " " + vars.Source + " \"$DEP_FILE\" $out \"";
      cldeps += mf->GetSafeDefinition("CMAKE_CL_SHOWINCLUDES_PREFIX");
      cldeps += "\" \"" + cl + "\" ";
    }
  } else {
    deptype = "gcc";
    const char* langdeptype = mf->GetDefinition("CMAKE_NINJA_DEPTYPE_" + lang);
    if (langdeptype) {
      deptype = langdeptype;
    }
    depfile = "$DEP_FILE";
    const std::string flagsName = "CMAKE_DEPFILE_FLAGS_" + lang;
    std::string depfileFlags = mf->GetSafeDefinition(flagsName);
    if (!depfileFlags.empty()) {
      cmSystemTools::ReplaceString(depfileFlags, "<DEPFILE>", "$DEP_FILE");
      cmSystemTools::ReplaceString(depfileFlags, "<OBJECT>", "$out");
      cmSystemTools::ReplaceString(depfileFlags, "<CMAKE_C_COMPILER>",
                                   mf->GetDefinition("CMAKE_C_COMPILER"));
      flags += " " + depfileFlags;
    }
  }

  vars.Flags = flags.c_str();
  vars.DependencyFile = depfile.c_str();

  CM_AUTO_PTR<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->GetLocalGenerator()->CreateRulePlaceholderExpander());

  std::string const tdi = this->GetLocalGenerator()->ConvertToOutputFormat(
    ConvertToNinjaPath(this->GetTargetDependInfoPath(lang)),
    cmLocalGenerator::SHELL);

  std::string launcher;
  const char* val = this->GetLocalGenerator()->GetRuleLauncher(
    this->GetGeneratorTarget(), "RULE_LAUNCH_COMPILE");
  if (val && *val) {
    launcher = val;
    launcher += " ";
  }

  if (explicitPP) {
    // Lookup the explicit preprocessing rule.
    std::string const ppVar = "CMAKE_" + lang + "_PREPROCESS_SOURCE";
    std::string const ppCmd =
      this->GetMakefile()->GetRequiredDefinition(ppVar);

    // Explicit preprocessing always uses a depfile.
    std::string const ppDeptype; // no deps= for multiple outputs
    std::string const ppDepfile = "$DEP_FILE";

    cmRulePlaceholderExpander::RuleVariables ppVars;
    ppVars.CMTargetName = vars.CMTargetName;
    ppVars.CMTargetType = vars.CMTargetType;
    ppVars.Language = vars.Language;
    ppVars.Object = "$out"; // for RULE_LAUNCH_COMPILE
    ppVars.PreprocessedSource = "$out";
    ppVars.DependencyFile = ppDepfile.c_str();

    // Preprocessing uses the original source,
    // compilation uses preprocessed output.
    ppVars.Source = vars.Source;
    vars.Source = "$in";

    // Preprocessing and compilation use the same flags.
    ppVars.Flags = vars.Flags;

    // Move preprocessor definitions to the preprocessor rule.
    ppVars.Defines = vars.Defines;
    vars.Defines = "";

    // Copy include directories to the preprocessor rule.  The Fortran
    // compilation rule still needs them for the INCLUDE directive.
    ppVars.Includes = vars.Includes;

    // Rule for preprocessing source file.
    std::vector<std::string> ppCmds;
    cmSystemTools::ExpandListArgument(ppCmd, ppCmds);

    for (std::vector<std::string>::iterator i = ppCmds.begin();
         i != ppCmds.end(); ++i) {
      *i = launcher + *i;
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   *i, ppVars);
    }

    // Run CMake dependency scanner on preprocessed output.
    std::string const cmake = this->GetLocalGenerator()->ConvertToOutputFormat(
      cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL);
    ppCmds.push_back(
      cmake + " -E cmake_ninja_depends"
              " --tdi=" +
      tdi + " --pp=$out"
            " --dep=$DEP_FILE" +
      (needDyndep ? " --obj=$OBJ_FILE --ddi=$DYNDEP_INTERMEDIATE_FILE" : ""));

    std::string const ppCmdLine =
      this->GetLocalGenerator()->BuildCommandLine(ppCmds);

    // Write the rule for preprocessing file of the given language.
    std::ostringstream ppComment;
    ppComment << "Rule for preprocessing " << lang << " files.";
    std::ostringstream ppDesc;
    ppDesc << "Building " << lang << " preprocessed $out";
    this->GetGlobalGenerator()->AddRule(this->LanguagePreprocessRule(lang),
                                        ppCmdLine, ppDesc.str(),
                                        ppComment.str(), ppDepfile, ppDeptype,
                                        /*rspfile*/ "",
                                        /*rspcontent*/ "",
                                        /*restat*/ "",
                                        /*generator*/ false);
  }

  if (needDyndep) {
    // Write the rule for ninja dyndep file generation.
    std::vector<std::string> ddCmds;

    // Command line length is almost always limited -> use response file for
    // dyndep rules
    std::string ddRspFile = "$out.rsp";
    std::string ddRspContent = "$in";
    std::string ddInput = "@" + ddRspFile;

    // Run CMake dependency scanner on preprocessed output.
    std::string const cmake = this->GetLocalGenerator()->ConvertToOutputFormat(
      cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL);
    ddCmds.push_back(cmake + " -E cmake_ninja_dyndep"
                             " --tdi=" +
                     tdi + " --dd=$out"
                           " " +
                     ddInput);

    std::string const ddCmdLine =
      this->GetLocalGenerator()->BuildCommandLine(ddCmds);

    std::ostringstream ddComment;
    ddComment << "Rule to generate ninja dyndep files for " << lang << ".";
    std::ostringstream ddDesc;
    ddDesc << "Generating " << lang << " dyndep file $out";
    this->GetGlobalGenerator()->AddRule(
      this->LanguageDyndepRule(lang), ddCmdLine, ddDesc.str(), ddComment.str(),
      /*depfile*/ "",
      /*deps*/ "", ddRspFile, ddRspContent,
      /*restat*/ "",
      /*generator*/ false);
  }

  // Rule for compiling object file.
  std::vector<std::string> compileCmds;
  if (lang == "CUDA") {
    std::string cmdVar;
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      cmdVar = std::string("CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION");
    } else if (this->GeneratorTarget->GetPropertyAsBool(
                 "CUDA_PTX_COMPILATION")) {
      cmdVar = std::string("CMAKE_CUDA_COMPILE_PTX_COMPILATION");
    } else {
      cmdVar = std::string("CMAKE_CUDA_COMPILE_WHOLE_COMPILATION");
    }
    std::string compileCmd = mf->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  } else {
    const std::string cmdVar =
      std::string("CMAKE_") + lang + "_COMPILE_OBJECT";
    std::string compileCmd = mf->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  }

  // Maybe insert an include-what-you-use runner.
  if (!compileCmds.empty() && (lang == "C" || lang == "CXX")) {
    std::string const iwyu_prop = lang + "_INCLUDE_WHAT_YOU_USE";
    const char* iwyu = this->GeneratorTarget->GetProperty(iwyu_prop);
    std::string const tidy_prop = lang + "_CLANG_TIDY";
    const char* tidy = this->GeneratorTarget->GetProperty(tidy_prop);
    std::string const cpplint_prop = lang + "_CPPLINT";
    const char* cpplint = this->GeneratorTarget->GetProperty(cpplint_prop);
    if ((iwyu && *iwyu) || (tidy && *tidy) || (cpplint && *cpplint)) {
      std::string run_iwyu = this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
      run_iwyu += " -E __run_iwyu";
      if (iwyu && *iwyu) {
        run_iwyu += " --iwyu=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(iwyu);
      }
      if (tidy && *tidy) {
        run_iwyu += " --tidy=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(tidy);
      }
      if (cpplint && *cpplint) {
        run_iwyu += " --cpplint=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(cpplint);
      }
      if ((tidy && *tidy) || (cpplint && *cpplint)) {
        run_iwyu += " --source=$in";
      }
      run_iwyu += " -- ";
      compileCmds.front().insert(0, run_iwyu);
    }
  }

  // Maybe insert a compiler launcher like ccache or distcc
  if (!compileCmds.empty() &&
      (lang == "C" || lang == "CXX" || lang == "CUDA")) {
    std::string const clauncher_prop = lang + "_COMPILER_LAUNCHER";
    const char* clauncher = this->GeneratorTarget->GetProperty(clauncher_prop);
    if (clauncher && *clauncher) {
      std::vector<std::string> launcher_cmd;
      cmSystemTools::ExpandListArgument(clauncher, launcher_cmd, true);
      for (std::vector<std::string>::iterator i = launcher_cmd.begin(),
                                              e = launcher_cmd.end();
           i != e; ++i) {
        *i = this->LocalGenerator->EscapeForShell(*i);
      }
      std::string const& run_launcher = cmJoin(launcher_cmd, " ") + " ";
      compileCmds.front().insert(0, run_launcher);
    }
  }

  if (!compileCmds.empty()) {
    compileCmds.front().insert(0, cldeps);
  }

  for (std::vector<std::string>::iterator i = compileCmds.begin();
       i != compileCmds.end(); ++i) {
    *i = launcher + *i;
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), *i,
                                                 vars);
  }

  std::string cmdLine =
    this->GetLocalGenerator()->BuildCommandLine(compileCmds);

  // Write the rule for compiling file of the given language.
  std::ostringstream comment;
  comment << "Rule for compiling " << lang << " files.";
  std::ostringstream description;
  description << "Building " << lang << " object $out";
  this->GetGlobalGenerator()->AddRule(
    this->LanguageCompilerRule(lang), cmdLine, description.str(),
    comment.str(), depfile, deptype, rspfile, rspcontent,
    /*restat*/ "",
    /*generator*/ false);
}